

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

void __thiscall
QItemSelectionModelPrivate::layoutAboutToBeChanged
          (QItemSelectionModelPrivate *this,QList<QPersistentModelIndex> *param_2,
          LayoutChangeHint hint)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  arrow_operator_result ppQVar4;
  int in_EDX;
  QItemSelection *in_RDI;
  long in_FS_OFFSET;
  QModelIndex parent;
  QItemSelectionRange range;
  QModelIndex *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QPersistentModelIndex>::clear
            ((QList<QPersistentModelIndex> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  QList<QPersistentModelIndex>::clear
            ((QList<QPersistentModelIndex> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::clear
            ((QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::clear
            ((QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  bVar1 = QList<QItemSelectionRange>::isEmpty((QList<QItemSelectionRange> *)0x829654);
  if ((bVar1) &&
     (qVar3 = QList<QItemSelectionRange>::size
                        ((QList<QItemSelectionRange> *)
                         &in_RDI[6].super_QList<QItemSelectionRange>.d.ptr), qVar3 == 1)) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QItemSelectionRange>::constFirst
              ((QList<QItemSelectionRange> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    QItemSelectionRange::QItemSelectionRange
              ((QItemSelectionRange *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (QItemSelectionRange *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
    ;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    QItemSelectionRange::parent
              ((QItemSelectionRange *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))
    ;
    ppQVar4 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
              ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                            *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    iVar2 = (*((*ppQVar4)->super_QObject)._vptr_QObject[0xf])(*ppQVar4,&local_38);
    *(int *)((long)&in_RDI[0xc].super_QList<QItemSelectionRange>.d.size + 4) = iVar2;
    ppQVar4 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
              ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                            *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    iVar2 = (*((*ppQVar4)->super_QObject)._vptr_QObject[0x10])(*ppQVar4,&local_38);
    *(int *)&in_RDI[0xc].super_QList<QItemSelectionRange>.d.size = iVar2;
    if (((*(int *)((long)&in_RDI[0xc].super_QList<QItemSelectionRange>.d.size + 4) *
          (int)in_RDI[0xc].super_QList<QItemSelectionRange>.d.size < 0x3e9) ||
        (((iVar2 = QItemSelectionRange::top((QItemSelectionRange *)0x82978b), iVar2 != 0 ||
          (iVar2 = QItemSelectionRange::left((QItemSelectionRange *)0x8297ab), iVar2 != 0)) ||
         (iVar2 = QItemSelectionRange::bottom((QItemSelectionRange *)0x8297cb),
         iVar2 != *(int *)((long)&in_RDI[0xc].super_QList<QItemSelectionRange>.d.size + 4) + -1))))
       || (in_stack_ffffffffffffff04 = QItemSelectionRange::right((QItemSelectionRange *)0x8297f4),
          in_stack_ffffffffffffff04 != (int)in_RDI[0xc].super_QList<QItemSelectionRange>.d.size + -1
          )) {
      bVar1 = false;
    }
    else {
      *(undefined1 *)&in_RDI[0xc].super_QList<QItemSelectionRange>.d.d = 1;
      QPersistentModelIndex::operator=
                ((QPersistentModelIndex *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffef8);
      bVar1 = true;
    }
    QItemSelectionRange::~QItemSelectionRange
              ((QItemSelectionRange *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))
    ;
    if (bVar1) goto LAB_00829992;
  }
  *(undefined1 *)&in_RDI[0xc].super_QList<QItemSelectionRange>.d.d = 0;
  if (in_EDX == 1) {
    qSelectionPersistentRowLengths(in_RDI);
    QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::operator=
              ((QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)in_stack_fffffffffffffef8);
    QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::~QList
              ((QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)0x8298dc);
    qSelectionPersistentRowLengths(in_RDI);
    QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::operator=
              ((QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)in_stack_fffffffffffffef8);
    QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::~QList
              ((QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)0x82991b);
  }
  else {
    qSelectionIndexes<QList<QPersistentModelIndex>>(in_RDI);
    QList<QPersistentModelIndex>::operator=
              ((QList<QPersistentModelIndex> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (QList<QPersistentModelIndex> *)in_stack_fffffffffffffef8);
    QList<QPersistentModelIndex>::~QList((QList<QPersistentModelIndex> *)0x82995c);
    qSelectionIndexes<QList<QPersistentModelIndex>>(in_RDI);
    QList<QPersistentModelIndex>::operator=
              ((QList<QPersistentModelIndex> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (QList<QPersistentModelIndex> *)in_stack_fffffffffffffef8);
    QList<QPersistentModelIndex>::~QList((QList<QPersistentModelIndex> *)0x829992);
  }
LAB_00829992:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QItemSelectionModelPrivate::layoutAboutToBeChanged(const QList<QPersistentModelIndex> &,
                                                        QAbstractItemModel::LayoutChangeHint hint)
{
    savedPersistentIndexes.clear();
    savedPersistentCurrentIndexes.clear();
    savedPersistentRowLengths.clear();
    savedPersistentCurrentRowLengths.clear();

    // optimization for when all indexes are selected
    // (only if there is lots of items (1000) because this is not entirely correct)
    if (ranges.isEmpty() && currentSelection.size() == 1) {
        QItemSelectionRange range = currentSelection.constFirst();
        QModelIndex parent = range.parent();
        tableRowCount = model->rowCount(parent);
        tableColCount = model->columnCount(parent);
        if (tableRowCount * tableColCount > 1000
            && range.top() == 0
            && range.left() == 0
            && range.bottom() == tableRowCount - 1
            && range.right() == tableColCount - 1) {
            tableSelected = true;
            tableParent = parent;
            return;
        }
    }
    tableSelected = false;

    if (hint == QAbstractItemModel::VerticalSortHint) {
        // Special case when we know we're sorting vertically. We can assume that all indexes for columns
        // are displaced the same way, and therefore we only need to track an index from one column per
        // row with a QPersistentModelIndex together with the length of items to the right of it
        // which are displaced the same way.
        // An algorithm which contains the same assumption is used to process layoutChanged.
        savedPersistentRowLengths = qSelectionPersistentRowLengths(ranges);
        savedPersistentCurrentRowLengths = qSelectionPersistentRowLengths(currentSelection);
    } else {
        savedPersistentIndexes = qSelectionIndexes<QList<QPersistentModelIndex>>(ranges);
        savedPersistentCurrentIndexes = qSelectionIndexes<QList<QPersistentModelIndex>>(currentSelection);
    }
}